

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-utils.cpp
# Opt level: O1

SortedVector *
wasm::ParamUtils::removeParameters
          (SortedVector *__return_storage_ptr__,
          vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *funcs,SortedVector *indexes,
          vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *calls,
          vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> *callRefs,Module *module,
          PassRunner *runner)

{
  pointer ppFVar1;
  Function *this;
  bool bVar2;
  pointer ppFVar3;
  size_t sVar4;
  Index x;
  
  if ((indexes->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (indexes->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    (__return_storage_ptr__->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (__return_storage_ptr__->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    (__return_storage_ptr__->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
  }
  else {
    ppFVar3 = (funcs->super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    ppFVar1 = (funcs->super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppFVar1 == ppFVar3) {
      __assert_fail("funcs.size() > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/param-utils.cpp"
                    ,0xb1,
                    "SortedVector wasm::ParamUtils::removeParameters(const std::vector<Function *> &, SortedVector, const std::vector<Call *> &, const std::vector<CallRef *> &, Module *, PassRunner *)"
                   );
    }
    this = *ppFVar3;
    do {
      if (((*ppFVar3)->type).id != (this->type).id) {
        __assert_fail("func->type == first->type",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/param-utils.cpp"
                      ,0xb5,
                      "SortedVector wasm::ParamUtils::removeParameters(const std::vector<Function *> &, SortedVector, const std::vector<Call *> &, const std::vector<CallRef *> &, Module *, PassRunner *)"
                     );
      }
      ppFVar3 = ppFVar3 + 1;
    } while (ppFVar3 != ppFVar1);
    sVar4 = Function::getNumParams(this);
    (__return_storage_ptr__->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (__return_storage_ptr__->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    (__return_storage_ptr__->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    x = (Index)sVar4;
    do {
      x = x - 1;
      bVar2 = SortedVector::has(indexes,x);
      if ((bVar2) && (bVar2 = removeParameter(funcs,x,calls,callRefs,module,runner), bVar2)) {
        SortedVector::insert(__return_storage_ptr__,x);
      }
    } while (x != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

SortedVector removeParameters(const std::vector<Function*>& funcs,
                              SortedVector indexes,
                              const std::vector<Call*>& calls,
                              const std::vector<CallRef*>& callRefs,
                              Module* module,
                              PassRunner* runner) {
  if (indexes.empty()) {
    return {};
  }

  assert(funcs.size() > 0);
  auto* first = funcs[0];
#ifndef NDEBUG
  for (auto* func : funcs) {
    assert(func->type == first->type);
  }
#endif

  // Iterate downwards, as we may remove more than one, and going forwards would
  // alter the indexes after us.
  Index i = first->getNumParams() - 1;
  SortedVector removed;
  while (1) {
    if (indexes.has(i)) {
      if (removeParameter(funcs, i, calls, callRefs, module, runner)) {
        // Success!
        removed.insert(i);
      }
    }
    if (i == 0) {
      break;
    }
    i--;
  }
  return removed;
}